

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

time_t clask::
       to_time_t<std::chrono::time_point<std::filesystem::__file_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                 (time_point<std::filesystem::__file_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  tp)

{
  time_t tVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  time_point<std::filesystem::__file_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  time_point local_18;
  type sctp;
  time_point<std::filesystem::__file_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tp_local;
  
  sctp.__d.__r = tp.__d.__r;
  local_30.__d.__r = (duration)std::filesystem::__file_clock::now();
  local_28.__r = (rep)std::chrono::operator-
                                ((time_point<std::filesystem::__file_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&sctp,&local_30);
  local_38.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_20 = std::chrono::operator+(&local_28,&local_38);
  local_18.__d.__r =
       (duration)
       std::chrono::
       time_point_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                 (&local_20);
  tVar1 = std::chrono::_V2::system_clock::to_time_t(&local_18);
  return tVar1;
}

Assistant:

std::time_t to_time_t(TP tp) {
  using namespace std::chrono;
  auto sctp = time_point_cast<system_clock::duration>(tp - TP::clock::now() + system_clock::now());
  return system_clock::to_time_t(sctp);
}